

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O3

void __thiscall
Eigen::internal::gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false>::operator()
          (gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> *this,double *blockA,double *_lhs,
          long lhsStride,long depth,long rows,long stride,long offset)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long i;
  ulong uVar4;
  double *pdVar5;
  long lVar6;
  ulong uVar7;
  double *pdVar8;
  long lVar9;
  long lVar10;
  
  if (offset != 0 || stride != 0) {
    __assert_fail("((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zonotopes[P]zono_cpp/Eigen/src/Core/products/GeneralBlockPanelKernel.h"
                  ,0x46d,
                  "void Eigen::internal::gemm_pack_lhs<double, long, 4, 2, 0>::operator()(Scalar *, const Scalar *__restrict, Index, Index, Index, Index, Index) [Scalar = double, Index = long, Pack1 = 4, Pack2 = 2, StorageOrder = 0, Conjugate = false, PanelMode = false]"
                 );
  }
  uVar7 = rows + 3;
  if (-1 < rows) {
    uVar7 = rows;
  }
  uVar4 = uVar7 & 0xfffffffffffffffc;
  if (rows < 4) {
    lVar6 = 0;
  }
  else {
    pdVar5 = _lhs + 2;
    lVar6 = 0;
    lVar10 = 0;
    do {
      lVar9 = depth;
      pdVar8 = pdVar5;
      if (0 < depth) {
        do {
          dVar1 = pdVar8[-1];
          dVar2 = *pdVar8;
          dVar3 = pdVar8[1];
          blockA[lVar6] = pdVar8[-2];
          (blockA + lVar6)[1] = dVar1;
          blockA[lVar6 + 2] = dVar2;
          (blockA + lVar6 + 2)[1] = dVar3;
          lVar6 = lVar6 + 4;
          pdVar8 = pdVar8 + lhsStride;
          lVar9 = lVar9 + -1;
        } while (lVar9 != 0);
      }
      lVar10 = lVar10 + 4;
      pdVar5 = pdVar5 + 4;
    } while (lVar10 < (long)uVar4);
  }
  if (1 < rows % 4) {
    if (0 < depth) {
      pdVar5 = _lhs + ((long)uVar7 >> 2) * 4;
      lVar10 = depth;
      do {
        dVar1 = pdVar5[1];
        blockA[lVar6] = *pdVar5;
        (blockA + lVar6)[1] = dVar1;
        lVar6 = lVar6 + 2;
        pdVar5 = pdVar5 + lhsStride;
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
    }
    uVar4 = uVar4 | 2;
  }
  if ((long)uVar4 < rows) {
    pdVar5 = _lhs + uVar4;
    do {
      pdVar8 = pdVar5;
      lVar10 = depth;
      if (0 < depth) {
        do {
          blockA[lVar6] = *pdVar8;
          lVar6 = lVar6 + 1;
          pdVar8 = pdVar8 + lhsStride;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
      }
      uVar4 = uVar4 + 1;
      pdVar5 = pdVar5 + 1;
    } while (uVar4 != rows);
  }
  return;
}

Assistant:

EIGEN_DONT_INLINE void gemm_pack_lhs<Scalar, Index, Pack1, Pack2, StorageOrder, Conjugate, PanelMode>
  ::operator()(Scalar* blockA, const Scalar* EIGEN_RESTRICT _lhs, Index lhsStride, Index depth, Index rows, Index stride, Index offset)
{
  typedef typename packet_traits<Scalar>::type Packet;
  enum { PacketSize = packet_traits<Scalar>::size };

  EIGEN_ASM_COMMENT("EIGEN PRODUCT PACK LHS");
  EIGEN_UNUSED_VARIABLE(stride)
  EIGEN_UNUSED_VARIABLE(offset)
  eigen_assert(((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride));
  eigen_assert( (StorageOrder==RowMajor) || ((Pack1%PacketSize)==0 && Pack1<=4*PacketSize) );
  conj_if<NumTraits<Scalar>::IsComplex && Conjugate> cj;
  const_blas_data_mapper<Scalar, Index, StorageOrder> lhs(_lhs,lhsStride);
  Index count = 0;
  Index peeled_mc = (rows/Pack1)*Pack1;
  for(Index i=0; i<peeled_mc; i+=Pack1)
  {
    if(PanelMode) count += Pack1 * offset;

    if(StorageOrder==ColMajor)
    {
      for(Index k=0; k<depth; k++)
      {
        Packet A, B, C, D;
        if(Pack1>=1*PacketSize) A = ploadu<Packet>(&lhs(i+0*PacketSize, k));
        if(Pack1>=2*PacketSize) B = ploadu<Packet>(&lhs(i+1*PacketSize, k));
        if(Pack1>=3*PacketSize) C = ploadu<Packet>(&lhs(i+2*PacketSize, k));
        if(Pack1>=4*PacketSize) D = ploadu<Packet>(&lhs(i+3*PacketSize, k));
        if(Pack1>=1*PacketSize) { pstore(blockA+count, cj.pconj(A)); count+=PacketSize; }
        if(Pack1>=2*PacketSize) { pstore(blockA+count, cj.pconj(B)); count+=PacketSize; }
        if(Pack1>=3*PacketSize) { pstore(blockA+count, cj.pconj(C)); count+=PacketSize; }
        if(Pack1>=4*PacketSize) { pstore(blockA+count, cj.pconj(D)); count+=PacketSize; }
      }
    }
    else
    {
      for(Index k=0; k<depth; k++)
      {
        // TODO add a vectorized transpose here
        Index w=0;
        for(; w<Pack1-3; w+=4)
        {
          Scalar a(cj(lhs(i+w+0, k))),
                  b(cj(lhs(i+w+1, k))),
                  c(cj(lhs(i+w+2, k))),
                  d(cj(lhs(i+w+3, k)));
          blockA[count++] = a;
          blockA[count++] = b;
          blockA[count++] = c;
          blockA[count++] = d;
        }
        if(Pack1%4)
          for(;w<Pack1;++w)
            blockA[count++] = cj(lhs(i+w, k));
      }
    }
    if(PanelMode) count += Pack1 * (stride-offset-depth);
  }
  if(rows-peeled_mc>=Pack2)
  {
    if(PanelMode) count += Pack2*offset;
    for(Index k=0; k<depth; k++)
      for(Index w=0; w<Pack2; w++)
        blockA[count++] = cj(lhs(peeled_mc+w, k));
    if(PanelMode) count += Pack2 * (stride-offset-depth);
    peeled_mc += Pack2;
  }
  for(Index i=peeled_mc; i<rows; i++)
  {
    if(PanelMode) count += offset;
    for(Index k=0; k<depth; k++)
      blockA[count++] = cj(lhs(i, k));
    if(PanelMode) count += (stride-offset-depth);
  }
}